

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_max_error(REF_INTERP ref_interp,REF_DBL *max_error)

{
  REF_NODE pRVar1;
  REF_NODE pRVar2;
  REF_INT *pRVar3;
  REF_DBL *pRVar4;
  REF_MPI ref_mpi;
  double *output;
  REF_CELL pRVar5;
  uint uVar6;
  ulong uVar7;
  void *pvVar8;
  void *pvVar9;
  REF_INT *proc;
  long lVar10;
  ulong uVar11;
  long lVar12;
  undefined8 uVar13;
  uint uVar14;
  size_t __size;
  long lVar15;
  char *pcVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  REF_INT n_donor;
  uint local_124;
  REF_MPI local_120;
  REF_INT *local_118;
  void *local_110;
  REF_INT *donor_ret;
  void *local_100;
  REF_INT *local_f8;
  REF_INT *recept_node;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_xyz;
  double *local_d0;
  REF_CELL local_c8;
  REF_INT *donor_cell;
  REF_DBL error;
  REF_DBL *max_error_local;
  REF_INT nodes [27];
  
  local_120 = ref_interp->ref_mpi;
  pRVar1 = ref_interp->to_grid->node;
  pRVar2 = ref_interp->from_grid->node;
  local_c8 = (&ref_interp->from_tet)[ref_interp->from_grid->twod != 0];
  *max_error = 0.0;
  uVar6 = pRVar1->max;
  uVar7 = 0;
  uVar11 = 0;
  if (0 < (int)uVar6) {
    uVar11 = (ulong)uVar6;
  }
  uVar14 = 0;
  for (; uVar11 != uVar7; uVar7 = uVar7 + 1) {
    if (((-1 < pRVar1->global[uVar7]) && (pRVar1->ref_mpi->id == pRVar1->part[uVar7])) &&
       (ref_interp->cell[uVar7] != -1)) {
      uVar14 = uVar14 + 1;
      local_124 = uVar14;
    }
  }
  max_error_local = max_error;
  if ((int)uVar14 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x956,
           "ref_interp_max_error","malloc recept_bary of REF_DBL negative");
    return 1;
  }
  local_d0 = max_error;
  pvVar8 = malloc((ulong)(uVar14 * 4) << 3);
  if (pvVar8 == (void *)0x0) {
    pcVar16 = "malloc recept_bary of REF_DBL NULL";
    uVar13 = 0x956;
LAB_0015b5b6:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar13
           ,"ref_interp_max_error",pcVar16);
    return 2;
  }
  __size = (ulong)uVar14 << 2;
  pvVar9 = malloc(__size);
  if (pvVar9 == (void *)0x0) {
    pcVar16 = "malloc recept_cell of REF_INT NULL";
    uVar13 = 0x957;
    goto LAB_0015b5b6;
  }
  local_100 = pvVar9;
  recept_node = (REF_INT *)malloc(__size);
  if (recept_node == (REF_INT *)0x0) {
    pcVar16 = "malloc recept_node of REF_INT NULL";
    uVar13 = 0x958;
    goto LAB_0015b5b6;
  }
  local_118 = recept_node;
  pvVar9 = malloc(__size);
  if (pvVar9 == (void *)0x0) {
    pcVar16 = "malloc recept_ret of REF_INT NULL";
    uVar13 = 0x959;
    goto LAB_0015b5b6;
  }
  local_110 = pvVar9;
  proc = (REF_INT *)malloc(__size);
  if (proc == (REF_INT *)0x0) {
    pcVar16 = "malloc recept_proc of REF_INT NULL";
    uVar13 = 0x95a;
    goto LAB_0015b5b6;
  }
  local_124 = 0;
  lVar10 = 0;
  uVar14 = 0;
  for (lVar12 = 0; lVar12 < (int)uVar6; lVar12 = lVar12 + 1) {
    if (((-1 < pRVar1->global[lVar12]) && (pRVar1->ref_mpi->id == pRVar1->part[lVar12])) &&
       (pRVar3 = ref_interp->cell, pRVar3[lVar12] != -1)) {
      pRVar4 = ref_interp->bary;
      for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
        *(undefined8 *)((long)pvVar8 + lVar15 * 8 + (long)(int)(uVar14 * 4) * 8) =
             *(undefined8 *)((long)pRVar4 + lVar15 * 8 + lVar10);
      }
      lVar15 = (long)(int)uVar14;
      proc[lVar15] = ref_interp->part[lVar12];
      *(REF_INT *)((long)local_100 + lVar15 * 4) = pRVar3[lVar12];
      local_118[lVar15] = (REF_INT)lVar12;
      *(REF_INT *)((long)local_110 + lVar15 * 4) = local_120->id;
      uVar14 = uVar14 + 1;
      local_124 = uVar14;
    }
    lVar10 = lVar10 + 0x20;
  }
  local_f8 = proc;
  uVar6 = ref_mpi_blindsend(local_120,proc,local_100,1,uVar14,&donor_cell,&n_donor,1);
  if (uVar6 == 0) {
    uVar6 = ref_mpi_blindsend(local_120,proc,local_110,1,uVar14,&donor_ret,&n_donor,1);
    if (uVar6 == 0) {
      uVar6 = ref_mpi_blindsend(local_120,proc,local_118,1,uVar14,&donor_node,&n_donor,1);
      if (uVar6 != 0) {
        pcVar16 = "blind send node";
        uVar13 = 0x972;
        uVar7 = (ulong)uVar6;
        goto LAB_0015b627;
      }
      uVar6 = ref_mpi_blindsend(local_120,proc,pvVar8,4,uVar14,&donor_bary,&n_donor,3);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x975,"ref_interp_max_error",(ulong)uVar6,"blind send bary");
        return uVar6;
      }
      free(proc);
      free(local_110);
      free(local_118);
      free(local_100);
      free(pvVar8);
      uVar7 = (ulong)(uint)n_donor;
      if (n_donor < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x97d,"ref_interp_max_error","malloc donor_xyz of REF_DBL negative");
        return 1;
      }
      pvVar8 = malloc(uVar7 * 0x18);
      if (pvVar8 == (void *)0x0) {
        pcVar16 = "malloc donor_xyz of REF_DBL NULL";
        uVar13 = 0x97d;
        goto LAB_0015b5b6;
      }
      for (lVar10 = 0; pRVar5 = local_c8, lVar10 < (int)uVar7; lVar10 = lVar10 + 1) {
        uVar6 = ref_cell_nodes(local_c8,donor_cell[lVar10],nodes);
        if (uVar6 != 0) {
          uVar7 = (ulong)uVar6;
          pcVar16 = "node needs to be localized";
          uVar13 = 0x981;
          goto LAB_0015b624;
        }
        uVar7 = (ulong)(uint)pRVar5->node_per;
        if (pRVar5->node_per < 1) {
          uVar7 = 0;
        }
        for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
          *(undefined8 *)((long)pvVar8 + lVar12 * 8 + lVar10 * 0x18) = 0;
          dVar17 = 0.0;
          for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
            dVar17 = dVar17 + donor_bary[(ulong)((uint)lVar10 & 0x3fffffff) * 4 + uVar11] *
                              pRVar2->real[(long)nodes[uVar11] * 0xf + (long)(int)lVar12];
            *(double *)((long)pvVar8 + lVar12 * 8 + lVar10 * 0x18) = dVar17;
          }
        }
        uVar7 = (ulong)(uint)n_donor;
      }
      free(donor_cell);
      free(donor_bary);
      ref_mpi = local_120;
      uVar6 = ref_mpi_blindsend(local_120,donor_ret,pvVar8,3,n_donor,&recept_xyz,
                                (REF_INT *)&local_124,3);
      if (uVar6 == 0) {
        uVar6 = ref_mpi_blindsend(ref_mpi,donor_ret,donor_node,1,n_donor,&recept_node,
                                  (REF_INT *)&local_124,1);
        if (uVar6 == 0) {
          free(pvVar8);
          free(donor_node);
          free(donor_ret);
          output = local_d0;
          lVar10 = 4;
          for (lVar12 = 0; lVar12 < (int)local_124; lVar12 = lVar12 + 1) {
            lVar15 = (long)recept_node[lVar12];
            pRVar4 = pRVar1->real;
            dVar19 = *(double *)((long)recept_xyz + lVar10 * 4 + -8) - pRVar4[lVar15 * 0xf + 1];
            dVar17 = *(double *)((long)recept_xyz + lVar10 * 4 + -0x10) - pRVar4[lVar15 * 0xf];
            dVar18 = *(double *)((long)recept_xyz + lVar10 * 4) - pRVar4[lVar15 * 0xf + 2];
            error = dVar18 * dVar18 + dVar19 * dVar19 + dVar17 * dVar17;
            dVar17 = *output;
            if ((*output <= SQRT(error)) && (dVar17 = SQRT(error), error < 0.0)) {
              dVar17 = sqrt(error);
            }
            *output = dVar17;
            lVar10 = lVar10 + 6;
          }
          free(recept_node);
          free(recept_xyz);
          error = *output;
          uVar6 = ref_mpi_max(local_120,&error,output,3);
          if (uVar6 == 0) {
            uVar6 = ref_mpi_bcast(local_120,&max_error_local,1,3);
            if (uVar6 == 0) {
              return 0;
            }
            uVar7 = (ulong)uVar6;
            pcVar16 = "max";
            uVar13 = 0x9a4;
          }
          else {
            uVar7 = (ulong)uVar6;
            pcVar16 = "max";
            uVar13 = 0x9a3;
          }
        }
        else {
          uVar7 = (ulong)uVar6;
          pcVar16 = "blind send node";
          uVar13 = 0x992;
        }
      }
      else {
        uVar7 = (ulong)uVar6;
        pcVar16 = "blind send bary";
        uVar13 = 0x98f;
      }
    }
    else {
      uVar7 = (ulong)uVar6;
      pcVar16 = "blind send ret";
      uVar13 = 0x96f;
    }
  }
  else {
    uVar7 = (ulong)uVar6;
    pcVar16 = "blind send cell";
    uVar13 = 0x96c;
  }
LAB_0015b624:
  uVar6 = (uint)uVar7;
LAB_0015b627:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar13,
         "ref_interp_max_error",uVar7,pcVar16);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_interp_max_error(REF_INTERP ref_interp,
                                        REF_DBL *max_error) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_CELL from_cell;
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_DBL error;
  REF_INT i, j;
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_xyz, *donor_xyz, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  *max_error = 0.0;

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      for (i = 0; i < 4; i++) {
        recept_bary[i + 4 * n_recept] = ref_interp->bary[i + 4 * node];
      }
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_xyz, 3 * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (i = 0; i < 3; i++) {
      donor_xyz[i + 3 * donation] = 0.0;
      for (j = 0; j < ref_cell_node_per(from_cell); j++) {
        donor_xyz[i + 3 * donation] +=
            donor_bary[j + 4 * donation] * ref_node_xyz(from_node, i, nodes[j]);
      }
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_xyz, 3, n_donor,
                        (void **)(&recept_xyz), &n_recept, REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_xyz);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    error =
        pow(recept_xyz[0 + 3 * receptor] - ref_node_xyz(to_node, 0, node), 2) +
        pow(recept_xyz[1 + 3 * receptor] - ref_node_xyz(to_node, 1, node), 2) +
        pow(recept_xyz[2 + 3 * receptor] - ref_node_xyz(to_node, 2, node), 2);
    *max_error = MAX(*max_error, sqrt(error));
  }
  ref_free(recept_node);
  ref_free(recept_xyz);

  error = *max_error;
  RSS(ref_mpi_max(ref_mpi, &error, max_error, REF_DBL_TYPE), "max");
  RSS(ref_mpi_bcast(ref_mpi, &max_error, 1, REF_DBL_TYPE), "max");

  return REF_SUCCESS;
}